

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmParseBlanketJSCoverage.cxx
# Opt level: O1

bool __thiscall cmParseBlanketJSCoverage::ReadJSONFile(cmParseBlanketJSCoverage *this,string *file)

{
  cmCTest *this_00;
  pointer pcVar1;
  ostream *poVar2;
  JSONParser parser;
  ostringstream cmCTestLog_msg;
  string local_1e0;
  long *local_1c0;
  long local_1b0 [2];
  JSONParser local_1a0;
  undefined1 local_190 [376];
  
  local_1a0.Coverage = this->Coverage;
  local_1a0._vptr_JSONParser = (_func_int **)&PTR__JSONParser_006d26b8;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_190);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"Parsing ",8);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_190,(file->_M_dataplus)._M_p,file->_M_string_length);
  std::ios::widen((char)poVar2->_vptr_basic_ostream[-3] + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  this_00 = this->CTest;
  std::__cxx11::stringbuf::str();
  cmCTest::Log(this_00,4,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CTest/cmParseBlanketJSCoverage.cxx"
               ,0xa1,(char *)local_1c0,this->Coverage->Quiet);
  if (local_1c0 != local_1b0) {
    operator_delete(local_1c0,local_1b0[0] + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_190);
  std::ios_base::~ios_base((ios_base *)(local_190 + 0x70));
  pcVar1 = (file->_M_dataplus)._M_p;
  local_1e0._M_dataplus._M_p = (pointer)&local_1e0.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1e0,pcVar1,pcVar1 + file->_M_string_length);
  JSONParser::ParseFile(&local_1a0,&local_1e0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
    operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
  }
  return true;
}

Assistant:

bool cmParseBlanketJSCoverage::ReadJSONFile(std::string file)
  {
  cmParseBlanketJSCoverage::JSONParser parser
     (this->Coverage);
  cmCTestOptionalLog(this->CTest,HANDLER_VERBOSE_OUTPUT,
       "Parsing " << file << std::endl, this->Coverage.Quiet);
  parser.ParseFile(file);
  return true;
  }